

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void CKNCF(int *ncf)

{
  int kd;
  int id;
  int *ncf_local;
  
  for (id = 0; id < 0x1b; id = id + 1) {
    ncf[id] = 0;
  }
  *ncf = 2;
  ncf[4] = 2;
  ncf[6] = 2;
  ncf[7] = 1;
  ncf[9] = 1;
  ncf[0xd] = 1;
  ncf[0xf] = 1;
  ncf[0x10] = 1;
  ncf[0x12] = 1;
  ncf[0x13] = 2;
  ncf[0x15] = 2;
  ncf[0x16] = 2;
  ncf[0x1a] = 2;
  return;
}

Assistant:

void
CKNCF(int* ncf)
{
  int id; // loop counter
  int kd = 3;
  // Zero ncf
  for (id = 0; id < kd * 9; ++id) {
    ncf[id] = 0;
  }

  // H2
  ncf[0 * kd + 0] = 2; // H

  // O2
  ncf[1 * kd + 1] = 2; // O

  // H2O
  ncf[2 * kd + 0] = 2; // H
  ncf[2 * kd + 1] = 1; // O

  // H
  ncf[3 * kd + 0] = 1; // H

  // O
  ncf[4 * kd + 1] = 1; // O

  // OH
  ncf[5 * kd + 0] = 1; // H
  ncf[5 * kd + 1] = 1; // O

  // HO2
  ncf[6 * kd + 0] = 1; // H
  ncf[6 * kd + 1] = 2; // O

  // H2O2
  ncf[7 * kd + 0] = 2; // H
  ncf[7 * kd + 1] = 2; // O

  // N2
  ncf[8 * kd + 2] = 2; // N
}